

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quad.cpp
# Opt level: O2

Vec2d ** __thiscall Quad::getExtremities(Quad *this)

{
  Vec2d *this_00;
  Vec2d *this_01;
  bool bVar1;
  Vec2d **ppVVar2;
  Vec2d *unaff_R14;
  int i;
  long lVar3;
  float fVar4;
  float fVar5;
  
  ppVVar2 = (Vec2d **)operator_new__(0x10);
  lVar3 = 0;
  bVar1 = false;
  do {
    if (this->vertexCount <= lVar3) {
      return ppVVar2;
    }
    this_00 = this->vertices[lVar3];
    if (bVar1) {
      fVar4 = Vec2d::getX(this_00);
      fVar5 = Vec2d::getX(unaff_R14);
      if (fVar4 <= fVar5) {
        fVar4 = Vec2d::getY(this_00);
        fVar5 = Vec2d::getY(unaff_R14);
        if (fVar4 <= fVar5) {
          *ppVVar2 = this_00;
          unaff_R14 = this_00;
        }
      }
      fVar4 = Vec2d::getX(this_00);
      this_01 = ppVVar2[1];
      fVar5 = Vec2d::getX(this_01);
      if (fVar5 <= fVar4) {
        fVar4 = Vec2d::getY(this_00);
        fVar5 = Vec2d::getY(this_01);
        if (fVar5 <= fVar4) goto LAB_00117a21;
      }
    }
    else {
      *ppVVar2 = this_00;
      unaff_R14 = this_00;
LAB_00117a21:
      ppVVar2[1] = this_00;
    }
    lVar3 = lVar3 + 1;
    bVar1 = true;
  } while( true );
}

Assistant:

Vec2d** Quad::getExtremities() {
    Vec2d** extremities = new Vec2d*[2];
    bool initialised = false;
    for (int i = 0; i < vertexCount; i++) {
        Vec2d* vec = vertices[i];
        if (!initialised) {
            extremities[0] = vec;
            extremities[1] = vec;
            initialised = true;
        } else {
            if (vec->getX() <= extremities[0]->getX() && vec->getY() <= extremities[0]->getY()) {
                extremities[0] = vec;
            }
            if (vec->getX() >= extremities[1]->getX() && vec->getY() >= extremities[1]->getY()) {
                extremities[1] = vec;
            }
        }
        vec = nullptr;
    }
    return extremities;
}